

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O0

void ObsGetHandCardKnowledge
               (pyhanabi_observation_t *observation,int pid,int index,
               pyhanabi_card_knowledge_t *knowledge)

{
  const_reference this;
  const_reference pvVar1;
  undefined8 *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  
  if (in_RDI == (long *)0x0) {
    __assert_fail("observation != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x2c2,
                  "void ObsGetHandCardKnowledge(pyhanabi_observation_t *, int, int, pyhanabi_card_knowledge_t *)"
                 );
  }
  if (*in_RDI != 0) {
    if (in_RCX != (undefined8 *)0x0) {
      hanabi_learning_env::HanabiObservation::Hands((HanabiObservation *)*in_RDI);
      this = std::
             vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
             ::at((vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                   *)CONCAT44(in_ESI,in_EDX),(size_type)in_RCX);
      hanabi_learning_env::HanabiHand::Knowledge(this);
      pvVar1 = std::
               vector<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
               ::at((vector<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
                     *)CONCAT44(in_ESI,in_EDX),(size_type)in_RCX);
      *in_RCX = pvVar1;
      return;
    }
    __assert_fail("knowledge != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x2c4,
                  "void ObsGetHandCardKnowledge(pyhanabi_observation_t *, int, int, pyhanabi_card_knowledge_t *)"
                 );
  }
  __assert_fail("observation->observation != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                ,0x2c3,
                "void ObsGetHandCardKnowledge(pyhanabi_observation_t *, int, int, pyhanabi_card_knowledge_t *)"
               );
}

Assistant:

void ObsGetHandCardKnowledge(pyhanabi_observation_t* observation, int pid,
                             int index, pyhanabi_card_knowledge_t* knowledge) {
  REQUIRE(observation != nullptr);
  REQUIRE(observation->observation != nullptr);
  REQUIRE(knowledge != nullptr);
  knowledge->knowledge =
      &(reinterpret_cast<hanabi_learning_env::HanabiObservation*>(
            observation->observation)
            ->Hands()
            .at(pid)
            .Knowledge()
            .at(index));
}